

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Z80Implementation.hpp
# Opt level: O2

void __thiscall
CPU::Z80::Processor<AmstradCPC::ConcreteMachine<true>,_false,_true>::assemble_page
          (Processor<AmstradCPC::ConcreteMachine<true>,_false,_true> *this,InstructionPage *target,
          InstructionTable *table,bool add_offsets)

{
  Type TVar1;
  MicroOp (*paMVar2) [30];
  Type *pTVar3;
  int c;
  long lVar4;
  MicroOp *pMVar5;
  ulong uVar6;
  size_type __n;
  MicroOp *pMVar7;
  ulong uVar8;
  ulong uVar9;
  vector<unsigned_long,_std::allocator<unsigned_long>_> operation_indices;
  size_t lengths [256];
  MicroOp *local_878;
  value_type local_870;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_868;
  InstructionPage *local_848;
  long local_840;
  ulong auStack_838 [257];
  
  __n = 0;
  pMVar5 = (MicroOp *)table;
  for (lVar4 = 0; lVar4 != 0x100; lVar4 = lVar4 + 1) {
    uVar6 = 0;
    pMVar7 = pMVar5;
    do {
      paMVar2 = (MicroOp (*) [30])&pMVar7->type;
      uVar6 = uVar6 + 1;
      pMVar7 = pMVar7 + 1;
    } while (((*paMVar2)[0].type & ~IncrementR) != DecodeOperation);
    auStack_838[lVar4] = uVar6;
    __n = __n + uVar6;
    pMVar5 = pMVar5 + 0x1e;
  }
  local_868._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_868._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_868._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<CPU::Z80::ProcessorStorage::MicroOp,_std::allocator<CPU::Z80::ProcessorStorage::MicroOp>_>
  ::reserve(&target->all_operations,__n);
  local_870 = (value_type)0x0;
  std::
  vector<CPU::Z80::ProcessorStorage::MicroOp_*,_std::allocator<CPU::Z80::ProcessorStorage::MicroOp_*>_>
  ::resize(&target->instructions,0x100,&local_870);
  local_878 = (*table)[0] + 1;
  lVar4 = 0;
  local_848 = target;
  do {
    if (lVar4 == 0x100) {
      for (lVar4 = 0;
          (pointer)((long)local_868._M_impl.super__Vector_impl_data._M_start + lVar4) !=
          local_868._M_impl.super__Vector_impl_data._M_finish; lVar4 = lVar4 + 8) {
        *(pointer *)
         ((long)(local_848->instructions).
                super__Vector_base<CPU::Z80::ProcessorStorage::MicroOp_*,_std::allocator<CPU::Z80::ProcessorStorage::MicroOp_*>_>
                ._M_impl.super__Vector_impl_data._M_start + lVar4) =
             (local_848->all_operations).
             super__Vector_base<CPU::Z80::ProcessorStorage::MicroOp,_std::allocator<CPU::Z80::ProcessorStorage::MicroOp>_>
             ._M_impl.super__Vector_impl_data._M_start +
             *(pointer)((long)local_868._M_impl.super__Vector_impl_data._M_start + lVar4);
      }
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_868);
      return;
    }
    local_870 = (value_type)
                ((long)(local_848->all_operations).
                       super__Vector_base<CPU::Z80::ProcessorStorage::MicroOp,_std::allocator<CPU::Z80::ProcessorStorage::MicroOp>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(local_848->all_operations).
                       super__Vector_base<CPU::Z80::ProcessorStorage::MicroOp,_std::allocator<CPU::Z80::ProcessorStorage::MicroOp>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 6);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_868,
               (unsigned_long *)&local_870);
    uVar6 = auStack_838[lVar4];
    local_840 = lVar4;
    for (uVar9 = 0; uVar9 < uVar6; uVar9 = uVar9 + 1) {
      TVar1 = (*table)[lVar4][uVar9].type;
      if (TVar1 == IndexedPlaceHolder) {
        uVar8 = uVar9 + 1;
        if (!add_offsets) {
          pMVar5 = local_878 + uVar9;
          do {
            uVar8 = uVar8 + 1;
            pTVar3 = &pMVar5->type;
            pMVar5 = pMVar5 + 1;
          } while (*pTVar3 != CalculateIndexAddress);
        }
LAB_0024984e:
        std::
        vector<CPU::Z80::ProcessorStorage::MicroOp,std::allocator<CPU::Z80::ProcessorStorage::MicroOp>>
        ::emplace_back<CPU::Z80::ProcessorStorage::MicroOp&>
                  ((vector<CPU::Z80::ProcessorStorage::MicroOp,std::allocator<CPU::Z80::ProcessorStorage::MicroOp>>
                    *)&target->all_operations,(*table)[lVar4] + uVar8);
        uVar9 = uVar8;
      }
      else {
        uVar8 = uVar9;
        if ((TVar1 != BusOperation) ||
           ((*table)[lVar4][uVar9].machine_cycle.length.super_WrappedInt<HalfCycles>.length_ != 0))
        goto LAB_0024984e;
      }
    }
    lVar4 = local_840 + 1;
    local_878 = local_878 + 0x1e;
  } while( true );
}

Assistant:

void Processor <T, uses_bus_request, uses_wait_line>
				::assemble_page(InstructionPage &target, InstructionTable &table, bool add_offsets) {
	std::size_t number_of_micro_ops = 0;
	std::size_t lengths[256];

	// Count number of micro-ops required.
	for(int c = 0; c < 256; c++) {
		std::size_t length = 0;
		while(!is_terminal(table[c][length].type)) length++;
		length++;
		lengths[c] = length;
		number_of_micro_ops += length;
	}

	// Allocate a landing area.
	std::vector<std::size_t> operation_indices;
	target.all_operations.reserve(number_of_micro_ops);
	target.instructions.resize(256, nullptr);

	// Copy in all programs, recording where they go.
	std::size_t destination = 0;
	for(std::size_t c = 0; c < 256; c++) {
		operation_indices.push_back(target.all_operations.size());
		for(std::size_t t = 0; t < lengths[c];) {
			// Skip zero-length bus cycles.
			if(table[c][t].type == MicroOp::BusOperation && table[c][t].machine_cycle.length.as_integral() == 0) {
				t++;
				continue;
			}

			// Skip optional waits if this instance doesn't use the wait line.
			if(table[c][t].machine_cycle.was_requested && !uses_wait_line) {
				t++;
				continue;
			}

			// If an index placeholder is hit then drop it, and if offsets aren't being added,
			// then also drop the indexing that follows, which is assumed to be everything
			// up to and including the next ::CalculateIndexAddress. Coupled to the INDEX() macro.
			if(table[c][t].type == MicroOp::IndexedPlaceHolder) {
				t++;
				if(!add_offsets) {
					while(table[c][t].type != MicroOp::CalculateIndexAddress) t++;
					t++;
				}
			}
			target.all_operations.emplace_back(table[c][t]);
			destination++;
			t++;
		}
	}

	// Since the vector won't change again, it's now safe to set pointers.
	std::size_t c = 0;
	for(std::size_t index : operation_indices) {
		target.instructions[c] = &target.all_operations[index];
		c++;
	}
}